

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void hero_sits(tgestate_t *state)

{
  uint8_t *in_RDI;
  
  set_roomdef(state,(room_t)((ulong)in_RDI >> 0x38),(int)in_RDI,0);
  hero_sit_sleep_common(state,in_RDI);
  return;
}

Assistant:

void hero_sits(tgestate_t *state)
{
  assert(state != NULL);

  set_roomdef(state,
              room_25_MESS_HALL,
              roomdef_25_BENCH_G,
              interiorobject_PRISONER_SAT_END_TABLE);
  hero_sit_sleep_common(state, &state->hero_in_breakfast);
}